

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O1

void polynomial_mod(field_t field,polynomial_t dividend,polynomial_t divisor,polynomial_t mod)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  field_logarithm_t *pfVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pfVar6 = field.log;
  uVar7 = dividend.order;
  if (uVar7 <= mod.order) {
    memcpy(mod.coeff,dividend.coeff,(ulong)(uVar7 + 1));
    uVar5 = divisor.order;
    iVar3 = uVar7 - uVar5;
    if (uVar5 <= uVar7 && uVar7 != 0) {
      bVar1 = pfVar6[divisor.coeff[divisor._8_8_ & 0xffffffff]];
      uVar4 = (ulong)uVar7;
      do {
        if ((ulong)mod.coeff[uVar4] != 0) {
          bVar2 = pfVar6[mod.coeff[uVar4]];
          uVar8 = 0;
          do {
            uVar9 = (ulong)divisor.coeff[uVar8];
            if (uVar9 != 0) {
              mod.coeff[(uint)(iVar3 + (int)uVar8)] =
                   mod.coeff[(uint)(iVar3 + (int)uVar8)] ^
                   field.exp[(ulong)pfVar6[uVar9] +
                             (ulong)((uint)(0xff < (uint)bVar2 + (uint)(byte)~bVar1) +
                                     (uint)bVar2 + (uint)(byte)~bVar1 & 0xff)];
            }
            uVar7 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar7;
          } while (uVar7 <= uVar5);
        }
        uVar4 = uVar4 - 1;
      } while (((uint)uVar4 != 0) && (iVar3 = iVar3 + -1, uVar5 <= (uint)uVar4));
    }
  }
  return;
}

Assistant:

void polynomial_mod(field_t field, polynomial_t dividend, polynomial_t divisor, polynomial_t mod) {
    // find the polynomial remainder of dividend mod divisor
    // do long division and return just the remainder (written to mod)

    if (mod.order < dividend.order) {
        // mod.order must be >= dividend.order (scratch space needed)
        // this is an error -- catch it in debug?
        return;
    }
    // initialize remainder as dividend
    memcpy(mod.coeff, dividend.coeff, sizeof(field_element_t) * (dividend.order + 1));

    // XXX make sure divisor[divisor_order] is nonzero
    field_logarithm_t divisor_leading = field.log[divisor.coeff[divisor.order]];
    // long division steps along one order at a time, starting at the highest order
    for (unsigned int i = dividend.order; i > 0; i--) {
        // look at the leading coefficient of dividend and divisor
        // if leading coefficient of dividend / leading coefficient of divisor is q
        //   then the next row of subtraction will be q * divisor
        // if order of q < 0 then what we have is the remainder and we are done
        if (i < divisor.order) {
            break;
        }
        if (mod.coeff[i] == 0) {
            continue;
        }
        unsigned int q_order = i - divisor.order;
        field_logarithm_t q_coeff = field_div_log(field, field.log[mod.coeff[i]], divisor_leading);

        // now that we've chosen q, multiply the divisor by q and subtract from
        //   our remainder. subtracting in GF(2^8) is XOR, just like addition
        for (unsigned int j = 0; j <= divisor.order; j++) {
            if (divisor.coeff[j] == 0) {
                continue;
            }
            // all of the multiplication is shifted up by q_order places
            mod.coeff[j + q_order] = field_add(field, mod.coeff[j + q_order],
                        field_mul_log_element(field, field.log[divisor.coeff[j]], q_coeff));
        }
    }
}